

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O2

mdef_t * mdef_init(char *mdeffile,int32 breport)

{
  char *pcVar1;
  glist_t pgVar2;
  int32 iVar3;
  int iVar4;
  uint size;
  int iVar5;
  mdef_t *m;
  FILE *__stream;
  hash_table_t *phVar6;
  ciphone_t *pcVar7;
  phone_t *ppVar8;
  uint16 **ppuVar9;
  ph_lc_t ***ppppVar10;
  char *pcVar11;
  int16 *piVar12;
  void *pvVar13;
  gnode_s *pgVar14;
  word_posn_t wpos;
  FILE *fp;
  FILE *extraout_RDX;
  FILE *extraout_RDX_00;
  FILE *extraout_RDX_01;
  FILE *extraout_RDX_02;
  FILE *extraout_RDX_03;
  FILE *extraout_RDX_04;
  FILE *extraout_RDX_05;
  FILE *extraout_RDX_06;
  FILE *extraout_RDX_07;
  FILE *pFVar15;
  FILE *extraout_RDX_08;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  char *val;
  long lVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  size_t __n;
  bool bVar24;
  undefined1 auVar25 [16];
  long lStackY_c80;
  undefined4 uVar26;
  int32 wlen;
  glist_t local_c68;
  char *local_c60;
  FILE *local_c58;
  int local_c50;
  int32 n;
  char *local_c48;
  long local_c40;
  char buf [1024];
  undefined4 local_838;
  char tag [1024];
  
  if (mdeffile == (char *)0x0) {
    pcVar11 = "No mdef-file\n";
    lVar23 = 0x200;
LAB_00130682:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c",
            lVar23,pcVar11);
  }
  else {
    if (breport != 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,0x203,"Reading model definition: %s\n",mdeffile);
    }
    m = (mdef_t *)
        __ckd_calloc__(1,0x60,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                       ,0x205);
    __stream = fopen(mdeffile,"r");
    if (__stream == (FILE *)0x0) {
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                     ,0x208,"Failed to open mdef file \'%s\' for reading",mdeffile);
      goto LAB_00130664;
    }
    iVar3 = noncomment_line(buf,(int32)__stream,fp);
    if (iVar3 < 0) {
      pcVar11 = "Empty file: %s\n";
      lStackY_c80 = 0x20b;
    }
    else {
      if ((buf._0_4_ == 0x46444d42) || (buf._0_4_ == 0x424d4446)) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                ,0x210,"Found byte-order mark %.4s, assuming this is a binary mdef file\n",buf);
        fclose(__stream);
        ckd_free(m);
        return (mdef_t *)0x0;
      }
      local_c60 = mdeffile;
      iVar4 = bcmp(buf,"0.3",3);
      if (iVar4 != 0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                ,0x217,"Version error: Expecting %s, but read %s\n","0.3",buf);
        goto LAB_00130664;
      }
      m->n_ci_sen = -1;
      m->n_sen = -1;
      m->n_tmat = -1;
      uVar22 = 0xffffffff;
      uVar19 = 0xffffffff;
      local_c68 = (glist_t)CONCAT44(local_c68._4_4_,0xffffffff);
      pFVar15 = extraout_RDX;
      local_c58 = __stream;
      do {
        do {
          iVar3 = noncomment_line(buf,(int32)local_c58,pFVar15);
          if (iVar3 < 0) {
            pcVar11 = "Incomplete header\n";
            lVar23 = 0x222;
            goto LAB_00130682;
          }
          iVar4 = __isoc99_sscanf(buf,"%d %s",&n,tag);
          size = n;
          if ((iVar4 != 2) || (n < 0)) {
            pcVar11 = "Error in header: %s\n";
            mdeffile = buf;
            lStackY_c80 = 0x225;
            goto LAB_0013065d;
          }
          iVar4 = bcmp(tag,"n_base",7);
          pFVar15 = extraout_RDX_00;
          if (iVar4 != 0) {
            iVar4 = bcmp(tag,"n_tri",6);
            pFVar15 = extraout_RDX_01;
            uVar18 = size;
            uVar21 = uVar22;
            if ((iVar4 != 0) &&
               (iVar4 = bcmp(tag,"n_state_map",0xc), pFVar15 = extraout_RDX_02, uVar18 = uVar19,
               uVar21 = size, iVar4 != 0)) {
              auVar25[0] = -(tag[0] == 'n');
              auVar25[1] = -(tag[1] == '_');
              auVar25[2] = -(tag[2] == 't');
              auVar25[3] = -(tag[3] == 'i');
              auVar25[4] = -(tag[4] == 'e');
              auVar25[5] = -(tag[5] == 'd');
              auVar25[6] = -(tag[6] == '_');
              auVar25[7] = -(tag[7] == 'c');
              auVar25[8] = -(tag[8] == 'i');
              auVar25[9] = -(tag[9] == '_');
              auVar25[10] = -(tag[10] == 's');
              auVar25[0xb] = -(tag[0xb] == 't');
              auVar25[0xc] = -(tag[0xc] == 'a');
              auVar25[0xd] = -(tag[0xd] == 't');
              auVar25[0xe] = -(tag[0xe] == 'e');
              auVar25[0xf] = -(tag[0xf] == '\0');
              if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar25[0xf] >> 7) << 0xf) == 0xffff) {
                m->n_ci_sen = size;
                uVar21 = uVar22;
              }
              else {
                iVar4 = bcmp(tag,"n_tied_state",0xd);
                if (iVar4 == 0) {
                  m->n_sen = size;
                  pFVar15 = extraout_RDX_03;
                  uVar21 = uVar22;
                }
                else {
                  iVar4 = bcmp(tag,"n_tied_tmat",0xc);
                  if (iVar4 != 0) {
                    pcVar11 = "Unknown header line: %s\n";
                    mdeffile = buf;
                    lStackY_c80 = 0x234;
                    goto LAB_0013065d;
                  }
                  m->n_tmat = size;
                  pFVar15 = extraout_RDX_04;
                  uVar21 = uVar22;
                }
              }
            }
            size = (uint)local_c68;
            uVar19 = uVar18;
            uVar22 = uVar21;
          }
          local_c68 = (glist_t)CONCAT44(local_c68._4_4_,size);
        } while (((int)(size | uVar19 | uVar22) < 0) || (uVar18 = m->n_ci_sen, (int)uVar18 < 0));
        uVar21 = m->n_sen;
        uVar17 = (ulong)uVar21;
      } while (((int)uVar21 < 0) || (iVar4 = m->n_tmat, iVar4 < 0));
      if ((((uVar18 <= uVar21) && (size != 0)) && (uVar18 != 0)) && (iVar4 != 0)) {
        if (size < 0x7fff) {
          uVar19 = uVar19 + size;
          if (uVar19 < 0x7fffffff) {
            if (uVar21 < 0x7fff) {
              if (iVar4 != 0x7fffffff) {
                m->n_emit_state = uVar22 / uVar19 - 1;
                if ((uVar22 / uVar19) * uVar19 == uVar22) {
                  m->n_ciphone = size;
                  phVar6 = hash_table_new(size,0);
                  m->ciphone_ht = phVar6;
                  local_c48 = (char *)(ulong)size;
                  pcVar7 = (ciphone_t *)
                           __ckd_calloc__((size_t)(ulong)size,0x10,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                          ,0x252);
                  m->ciphone = pcVar7;
                  m->n_phone = uVar19;
                  ppVar8 = (phone_t *)
                           __ckd_calloc__((ulong)uVar19,0x14,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                          ,0x256);
                  m->phone = ppVar8;
                  ppuVar9 = (uint16 **)
                            __ckd_calloc_2d__((long)m->n_phone,(long)m->n_emit_state,2,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                              ,0x259);
                  m->sseq = ppuVar9;
                  ppppVar10 = (ph_lc_t ***)
                              __ckd_calloc_2d__(4,(long)m->n_ciphone,8,
                                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                                ,0x25d);
                  m->wpos_ci_lclist = ppppVar10;
                  val = (char *)0x0;
                  pFVar15 = extraout_RDX_05;
                  while (val != local_c48) {
                    iVar3 = noncomment_line(buf,(int32)local_c58,pFVar15);
                    if (iVar3 < 0) {
                      pcVar11 = "Premature EOF reading CIphone %d\n";
                      lVar23 = 0x267;
                      uVar17 = (ulong)val & 0xffffffff;
                      goto LAB_0013079a;
                    }
                    iVar4 = __isoc99_sscanf(buf,"%s%n",&local_838,&wlen);
                    if (iVar4 != 1) {
                      pcVar11 = "Missing base phone name: %s\n";
                      lStackY_c80 = 0x146;
                      mdeffile = buf;
                      goto LAB_0013065d;
                    }
                    lVar23 = (long)wlen;
                    iVar4 = mdef_ciphone_id(m,(char *)&local_838);
                    if (-1 < iVar4) {
                      pcVar11 = "Duplicate base phone: %s\n";
                      lStackY_c80 = 0x14c;
                      mdeffile = buf;
                      goto LAB_0013065d;
                    }
                    if ((long)m->n_ciphone <= (long)val) {
                      __assert_fail("p < m->n_ciphone",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                    ,0x65,"void ciphone_add(mdef_t *, char *, int)");
                    }
                    pcVar11 = __ckd_salloc__((char *)&local_838,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                             ,0x67);
                    m->ciphone[(long)val].name = pcVar11;
                    pcVar11 = (char *)hash_table_enter(m->ciphone_ht,pcVar11,val);
                    local_c60 = val;
                    if (pcVar11 != val) {
                      pcVar11 = "hash_table_enter(%s) failed; duplicate CIphone?\n";
                      lStackY_c80 = 0x6b;
                      mdeffile = m->ciphone[(long)val].name;
                      goto LAB_0013065d;
                    }
                    pcVar11 = buf + lVar23;
                    iVar4 = 3;
                    while( true ) {
                      iVar5 = __isoc99_sscanf(pcVar11,"%s%n",&local_838,&wlen);
                      bVar24 = iVar4 == 0;
                      iVar4 = iVar4 + -1;
                      if (bVar24) break;
                      if ((iVar5 != 1) || ((short)local_838 != 0x2d)) {
                        pcVar11 = "Bad context info for base phone: %s\n";
                        lStackY_c80 = 0x156;
                        mdeffile = buf;
                        goto LAB_0013065d;
                      }
                      pcVar11 = pcVar11 + wlen;
                    }
                    if (iVar5 != 1) {
                      pcVar11 = "Missing filler attribute field: %s\n";
                      lStackY_c80 = 0x15c;
                      mdeffile = buf;
                      goto LAB_0013065d;
                    }
                    lVar23 = (long)wlen;
                    iVar4 = bcmp(&local_838,"filler",7);
                    pcVar1 = local_c60;
                    iVar3 = 1;
                    if ((iVar4 != 0) && (iVar3 = 0, local_838 != 0x612f6e)) {
                      pcVar11 = "Bad filler attribute field: %s\n";
                      lStackY_c80 = 0x163;
                      mdeffile = buf;
                      goto LAB_0013065d;
                    }
                    m->ciphone[(long)val].filler = iVar3;
                    iVar4 = (int)local_c60;
                    triphone_add(m,iVar4,-1,-1,WORD_POSN_UNDEFINED,iVar4);
                    parse_tmat_senmap(m,buf,(long)(pcVar11 + (lVar23 - (long)buf)),iVar4);
                    pFVar15 = extraout_RDX_06;
                    val = pcVar1 + 1;
                  }
                  iVar4 = mdef_ciphone_id(m,"SIL");
                  m->sil = (int16)iVar4;
                  pFVar15 = extraout_RDX_07;
                  uVar22 = (uint)local_c68;
                  while( true ) {
                    iVar4 = m->n_phone;
                    iVar3 = noncomment_line(buf,(int32)local_c58,pFVar15);
                    if (iVar4 <= (int)uVar22) break;
                    uVar17 = (ulong)uVar22;
                    if (iVar3 < 0) {
                      pcVar11 = "Premature EOF reading phone %d\n";
                      lVar23 = 0x26f;
LAB_0013079a:
                      err_msg(ERR_FATAL,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                              ,lVar23,pcVar11,uVar17);
                      goto LAB_00130664;
                    }
                    iVar4 = __isoc99_sscanf(buf,"%s%n",&local_838,&wlen);
                    if (iVar4 != 1) {
                      pcVar11 = "Missing base phone name: %s\n";
                      lStackY_c80 = 0x178;
                      mdeffile = buf;
                      goto LAB_0013065d;
                    }
                    lVar23 = (long)wlen;
                    iVar4 = mdef_ciphone_id(m,(char *)&local_838);
                    local_c60 = (char *)CONCAT44(local_c60._4_4_,iVar4);
                    if (iVar4 < 0) {
                      pcVar11 = "Unknown base phone: %s\n";
                      lStackY_c80 = 0x17d;
                      mdeffile = buf;
                      goto LAB_0013065d;
                    }
                    local_c68 = (glist_t)CONCAT44(local_c68._4_4_,uVar22);
                    pcVar11 = buf + lVar23;
                    iVar4 = __isoc99_sscanf(pcVar11,"%s%n",&local_838,&wlen);
                    if (iVar4 != 1) {
                      pcVar11 = "Missing left context: %s\n";
                      lStackY_c80 = 0x181;
                      mdeffile = buf;
                      goto LAB_0013065d;
                    }
                    lVar23 = (long)wlen;
                    iVar4 = mdef_ciphone_id(m,(char *)&local_838);
                    if (iVar4 < 0) {
                      pcVar11 = "Unknown left context: %s\n";
                      lStackY_c80 = 0x185;
                      mdeffile = buf;
                      goto LAB_0013065d;
                    }
                    pcVar11 = pcVar11 + lVar23;
                    iVar5 = __isoc99_sscanf(pcVar11,"%s%n",&local_838,&wlen);
                    if (iVar5 != 1) {
                      pcVar11 = "Missing right context: %s\n";
                      lStackY_c80 = 0x189;
                      mdeffile = buf;
                      goto LAB_0013065d;
                    }
                    lVar23 = (long)wlen;
                    local_c50 = iVar4;
                    iVar4 = mdef_ciphone_id(m,(char *)&local_838);
                    if (iVar4 < 0) {
                      pcVar11 = "Unknown right  context: %s\n";
                      lStackY_c80 = 0x18d;
                      mdeffile = buf;
                      goto LAB_0013065d;
                    }
                    pcVar11 = pcVar11 + lVar23;
                    iVar5 = __isoc99_sscanf(pcVar11,"%s%n",&local_838,&wlen);
                    if ((iVar5 != 1) || (local_838._1_1_ != '\0')) {
                      pcVar11 = "Missing or bad word-position spec: %s\n";
                      lStackY_c80 = 0x191;
                      mdeffile = buf;
                      goto LAB_0013065d;
                    }
                    lVar23 = (long)wlen;
                    wpos = WORD_POSN_BEGIN;
                    if ((local_838 & 0xff) != 0x62) {
                      if ((local_838 & 0xff) == 0x73) {
                        wpos = WORD_POSN_SINGLE;
                      }
                      else if ((local_838 & 0xff) == 0x69) {
                        wpos = WORD_POSN_INTERNAL;
                      }
                      else {
                        if ((local_838 & 0xff) != 0x65) {
                          pcVar11 = "Bad word-position spec: %s\n";
                          lStackY_c80 = 0x1a1;
                          mdeffile = buf;
                          goto LAB_0013065d;
                        }
                        wpos = WORD_POSN_END;
                      }
                    }
                    iVar5 = __isoc99_sscanf(pcVar11 + lVar23,"%s%n",&local_838,&wlen);
                    if (iVar5 != 1) {
                      pcVar11 = "Missing filler attribute field: %s\n";
                      lStackY_c80 = 0x1a6;
                      mdeffile = buf;
                      goto LAB_0013065d;
                    }
                    local_c40 = (long)wlen;
                    iVar5 = bcmp(&local_838,"filler",7);
                    lVar20 = local_c40;
                    if (((iVar5 != 0) || (m->ciphone[(ulong)local_c60 & 0xffffffff].filler == 0)) &&
                       ((local_838 != 0x612f6e ||
                        (m->ciphone[(ulong)local_c60 & 0xffffffff].filler != 0)))) {
                      pcVar11 = "Bad filler attribute field: %s\n";
                      lStackY_c80 = 0x1ad;
                      mdeffile = buf;
                      goto LAB_0013065d;
                    }
                    iVar5 = (uint)local_c68;
                    triphone_add(m,(int)local_c60,local_c50,iVar4,wpos,(uint)local_c68);
                    parse_tmat_senmap(m,buf,(long)(pcVar11 + lVar23 + (lVar20 - (long)buf)),iVar5);
                    uVar22 = iVar5 + 1;
                    pFVar15 = extraout_RDX_08;
                  }
                  if (-1 < iVar3) {
                    err_msg(ERR_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                            ,0x275,"Non-empty file beyond expected #phones (%d)\n",
                            (ulong)(uint)m->n_phone);
                  }
                  pcVar11 = local_c48;
                  if (m->n_emit_state * m->n_ciphone == m->n_ci_sen) {
                    piVar12 = (int16 *)__ckd_calloc__((long)m->n_sen,2,
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                                  ,0x27c);
                    m->cd2cisen = piVar12;
                    piVar12 = (int16 *)__ckd_calloc__((long)m->n_sen,2,
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                                  ,0x27e);
                    m->sen2cimap = piVar12;
                    uVar16 = 0;
                    uVar17 = (ulong)(uint)m->n_sen;
                    if (m->n_sen < 1) {
                      uVar17 = uVar16;
                    }
                    for (; uVar17 != uVar16; uVar16 = uVar16 + 1) {
                      piVar12[uVar16] = -1;
                    }
                    uVar16 = 0;
                    uVar17 = (ulong)(uint)m->n_ci_sen;
                    if (m->n_ci_sen < 1) {
                      uVar17 = uVar16;
                    }
                    for (; uVar17 != uVar16; uVar16 = uVar16 + 1) {
                      m->cd2cisen[uVar16] = (int16)uVar16;
                      piVar12[uVar16] =
                           (int16)((long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 |
                                         uVar16 & 0xffffffff) / (long)m->n_emit_state);
                    }
                    iVar4 = m->n_phone;
                    for (; (int)pcVar11 < iVar4; pcVar11 = pcVar11 + 1) {
                      uVar22 = m->n_emit_state;
                      if (m->n_emit_state < 1) {
                        uVar22 = 0;
                      }
                      for (uVar17 = 0; uVar22 != uVar17; uVar17 = uVar17 + 1) {
                        ppVar8 = m->phone;
                        uVar16 = (ulong)((uint)m->sseq[(long)pcVar11][uVar17] * 2);
                        *(uint16 *)((long)m->cd2cisen + uVar16) =
                             m->sseq[ppVar8[(long)pcVar11].ci][uVar17];
                        *(int16 *)((long)piVar12 + uVar16) = ppVar8[(long)pcVar11].ci;
                      }
                    }
                    iVar5 = m->n_emit_state;
                    lVar23 = 0;
                    phVar6 = hash_table_new(iVar4,0);
                    __n = (size_t)(iVar5 * 2);
                    uVar22 = 0;
                    for (lVar20 = 0; lVar20 < m->n_phone; lVar20 = lVar20 + 1) {
                      pvVar13 = hash_table_enter_bkey
                                          (phVar6,(char *)m->sseq[lVar20],__n,(void *)(ulong)uVar22)
                      ;
                      local_838 = (uint)pvVar13;
                      uVar22 = uVar22 + (uVar22 == local_838);
                      *(uint *)((long)&m->phone->ssid + lVar23) = local_838;
                      lVar23 = lVar23 + 0x14;
                    }
                    ppuVar9 = (uint16 **)
                              __ckd_calloc_2d__((size_t)(ulong)uVar22,(long)m->n_emit_state,2,
                                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                                ,0x1d1);
                    pgVar14 = hash_table_tolist(phVar6,&local_838);
                    pgVar2 = pgVar14;
                    if (local_838 == uVar22) {
                      for (; local_c68 = pgVar2, pgVar14 != (glist_t)0x0; pgVar14 = pgVar14->next) {
                        local_838 = (uint)*(undefined8 *)((long)(pgVar14->data).ptr + 0x10);
                        memcpy(ppuVar9[(int)local_838],*(pgVar14->data).ptr,__n);
                        pgVar2 = local_c68;
                      }
                      glist_free(local_c68);
                      ckd_free_2d(m->sseq);
                      m->sseq = ppuVar9;
                      m->n_sseq = uVar22;
                      hash_table_free(phVar6);
                      fclose(local_c58);
                      return m;
                    }
                    __assert_fail("j == n_sseq",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                  ,0x1d4,"void sseq_compress(mdef_t *)");
                  }
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                          ,0x27b,"#CI-senones(%d) != #CI-phone(%d) x #emitting-states(%d)\n",
                          (ulong)(uint)m->n_ci_sen,(ulong)(uint)m->n_ciphone,m->n_emit_state);
                  goto LAB_00130664;
                }
                pcVar11 = "Header error: n_state_map not a multiple of n_ci*n_tri\n";
                lVar23 = 0x24d;
                goto LAB_00130682;
              }
              uVar26 = 0x7fffffff;
              pcVar11 = "%s: #tmats (%d) exceeds limit (%d)\n";
              lVar23 = 0x248;
              uVar17 = 0x7fffffff;
            }
            else {
              uVar26 = 0x7fff;
              pcVar11 = "%s: #senones (%d) exceeds limit (%d)\n";
              lVar23 = 0x245;
            }
          }
          else {
            uVar26 = 0x7fffffff;
            pcVar11 = "%s: #Phones (%d) exceeds limit (%d)\n";
            lVar23 = 0x242;
            uVar17 = (ulong)uVar19;
          }
        }
        else {
          uVar26 = 0x7fff;
          pcVar11 = "%s: #CI phones (%d) exceeds limit (%d)\n";
          lVar23 = 0x23f;
          uVar17 = (ulong)size;
        }
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                ,lVar23,pcVar11,local_c60,uVar17,uVar26);
        goto LAB_00130664;
      }
      pcVar11 = "%s: Error in header\n";
      lStackY_c80 = 0x23a;
      mdeffile = local_c60;
    }
LAB_0013065d:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c",
            lStackY_c80,pcVar11,mdeffile);
  }
LAB_00130664:
  exit(1);
}

Assistant:

mdef_t *
mdef_init(char *mdeffile, int32 breport)
{
    FILE *fp;
    int32 n_ci, n_tri, n_map, n;
    __BIGSTACKVARIABLE__ char tag[1024], buf[1024];
    uint16 **senmap;
    int p;
    int32 s, ci, cd;
    mdef_t *m;

    if (!mdeffile)
        E_FATAL("No mdef-file\n");

    if (breport)
        E_INFO("Reading model definition: %s\n", mdeffile);

    m = (mdef_t *) ckd_calloc(1, sizeof(mdef_t));       /* freed in mdef_free */

    if ((fp = fopen(mdeffile, "r")) == NULL)
        E_FATAL_SYSTEM("Failed to open mdef file '%s' for reading", mdeffile);

    if (noncomment_line(buf, sizeof(buf), fp) < 0)
        E_FATAL("Empty file: %s\n", mdeffile);

    if (strncmp(buf, "BMDF", 4) == 0 || strncmp(buf, "FDMB", 4) == 0) {
        E_INFO
            ("Found byte-order mark %.4s, assuming this is a binary mdef file\n",
             buf);
        fclose(fp);
        ckd_free(m);
        return NULL;
    }
    if (strncmp(buf, MODEL_DEF_VERSION, strlen(MODEL_DEF_VERSION)) != 0)
        E_FATAL("Version error: Expecting %s, but read %s\n",
                MODEL_DEF_VERSION, buf);

    /* Read #base phones, #triphones, #senone mappings defined in header */
    n_ci = -1;
    n_tri = -1;
    n_map = -1;
    m->n_ci_sen = -1;
    m->n_sen = -1;
    m->n_tmat = -1;
    do {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Incomplete header\n");

        if ((sscanf(buf, "%d %s", &n, tag) != 2) || (n < 0))
            E_FATAL("Error in header: %s\n", buf);

        if (strcmp(tag, "n_base") == 0)
            n_ci = n;
        else if (strcmp(tag, "n_tri") == 0)
            n_tri = n;
        else if (strcmp(tag, "n_state_map") == 0)
            n_map = n;
        else if (strcmp(tag, "n_tied_ci_state") == 0)
            m->n_ci_sen = n;
        else if (strcmp(tag, "n_tied_state") == 0)
            m->n_sen = n;
        else if (strcmp(tag, "n_tied_tmat") == 0)
            m->n_tmat = n;
        else
            E_FATAL("Unknown header line: %s\n", buf);
    } while ((n_ci < 0) || (n_tri < 0) || (n_map < 0) ||
             (m->n_ci_sen < 0) || (m->n_sen < 0) || (m->n_tmat < 0));

    if ((n_ci == 0) || (m->n_ci_sen == 0) || (m->n_tmat == 0)
        || (m->n_ci_sen > m->n_sen))
        E_FATAL("%s: Error in header\n", mdeffile);

    /* Check typesize limits */
    if (n_ci >= MAX_INT16)
        E_FATAL("%s: #CI phones (%d) exceeds limit (%d)\n", mdeffile, n_ci,
                MAX_INT16);
    if ((int64)n_ci + n_tri >= MAX_INT32)
        E_FATAL("%s: #Phones (%d) exceeds limit (%d)\n", mdeffile,
                n_ci + n_tri, MAX_INT32);
    if (m->n_sen >= MAX_INT16)
        E_FATAL("%s: #senones (%d) exceeds limit (%d)\n", mdeffile,
                m->n_sen, MAX_INT16);
    if (m->n_tmat >= MAX_INT32) /* Comparison is always false... */
        E_FATAL("%s: #tmats (%d) exceeds limit (%d)\n", mdeffile,
                m->n_tmat, MAX_INT32);

    m->n_emit_state = (n_map / (n_ci + n_tri)) - 1;
    if ((m->n_emit_state + 1) * (n_ci + n_tri) != n_map)
        E_FATAL
            ("Header error: n_state_map not a multiple of n_ci*n_tri\n");

    /* Initialize ciphone info */
    m->n_ciphone = n_ci;
    m->ciphone_ht = hash_table_new(n_ci, HASH_CASE_YES);  /* With case-insensitive string names *//* freed in mdef_free */
    m->ciphone = (ciphone_t *) ckd_calloc(n_ci, sizeof(ciphone_t));     /* freed in mdef_free */

    /* Initialize phones info (ciphones + triphones) */
    m->n_phone = n_ci + n_tri;
    m->phone = (phone_t *) ckd_calloc(m->n_phone, sizeof(phone_t));     /* freed in mdef_free */

    /* Allocate space for state->senone map for each phone */
    senmap = ckd_calloc_2d(m->n_phone, m->n_emit_state, sizeof(**senmap));      /* freed in mdef_free */
    m->sseq = senmap;           /* TEMPORARY; until it is compressed into just the unique ones */

    /* Allocate initial space for <ci,lc,rc,wpos> -> pid mapping */
    m->wpos_ci_lclist = (ph_lc_t ***) ckd_calloc_2d(N_WORD_POSN, m->n_ciphone, sizeof(ph_lc_t *));      /* freed in mdef_free */

    /*
     * Read base phones and triphones.  They'll simply be assigned a running sequence
     * number as their "phone-id".  If the phone-id < n_ci, it's a ciphone.
     */

    /* Read base phones */
    for (p = 0; p < n_ci; p++) {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Premature EOF reading CIphone %d\n", p);
        parse_base_line(m, buf, p);
    }
    m->sil = mdef_ciphone_id(m, S3_SILENCE_CIPHONE);

    /* Read triphones, if any */
    for (; p < m->n_phone; p++) {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Premature EOF reading phone %d\n", p);
        parse_tri_line(m, buf, p);
    }

    if (noncomment_line(buf, sizeof(buf), fp) >= 0)
        E_ERROR("Non-empty file beyond expected #phones (%d)\n",
                m->n_phone);

    /* Build CD senones to CI senones map */
    if (m->n_ciphone * m->n_emit_state != m->n_ci_sen)
        E_FATAL
            ("#CI-senones(%d) != #CI-phone(%d) x #emitting-states(%d)\n",
             m->n_ci_sen, m->n_ciphone, m->n_emit_state);
    m->cd2cisen = (int16 *) ckd_calloc(m->n_sen, sizeof(*m->cd2cisen)); /* freed in mdef_free */

    m->sen2cimap = (int16 *) ckd_calloc(m->n_sen, sizeof(*m->sen2cimap)); /* freed in mdef_free */

    for (s = 0; s < m->n_sen; s++)
        m->sen2cimap[s] = -1;
    for (s = 0; s < m->n_ci_sen; s++) { /* CI senones */
        m->cd2cisen[s] = s;
        m->sen2cimap[s] = s / m->n_emit_state;
    }
    for (p = n_ci; p < m->n_phone; p++) {       /* CD senones */
        for (s = 0; s < m->n_emit_state; s++) {
            cd = m->sseq[p][s];
            ci = m->sseq[m->phone[p].ci][s];
            m->cd2cisen[cd] = ci;
            m->sen2cimap[cd] = m->phone[p].ci;
        }
    }

    sseq_compress(m);
    fclose(fp);

    return m;
}